

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O2

void __thiscall
amrex::Geometry::periodicShift
          (Geometry *this,Box *target,Box *src,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *out)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Box locsrc;
  IntVect local_44;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_38;
  
  local_38 = &out->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&out->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,0);
  locsrc.smallend.vect._0_8_ = *(undefined8 *)(src->smallend).vect;
  uVar1 = *(undefined8 *)((src->smallend).vect + 2);
  locsrc._20_8_ = *(undefined8 *)((src->bigend).vect + 2);
  locsrc.bigend.vect[1] = (int)((ulong)*(undefined8 *)(src->bigend).vect >> 0x20);
  locsrc.smallend.vect[2] = (int)uVar1;
  locsrc.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
  iVar6 = -1;
  do {
    if (iVar6 == 2) {
      return;
    }
    if (iVar6 == 0) {
LAB_00534952:
      for (iVar3 = -1; iVar3 != 2; iVar3 = iVar3 + 1) {
        if (iVar3 == 0) {
LAB_00534988:
          for (iVar4 = -1; iVar4 != 2; iVar4 = iVar4 + 1) {
            if (iVar4 == 0) {
LAB_005349c8:
              if ((iVar3 != 0 || iVar6 != 0) || iVar4 != 0) {
                bVar2 = Box::intersects(target,&locsrc);
                if (bVar2) {
                  local_44.vect[0] =
                       (((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) *
                       iVar6;
                  local_44.vect[1] =
                       (((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1) *
                       iVar3;
                  local_44.vect[2] =
                       (((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
                       iVar4;
                  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
                  emplace_back<amrex::IntVect>(local_38,&local_44);
                }
                if ((iVar4 != 0) && ((this->super_CoordSys).field_0x53 == '\x01')) {
                  iVar5 = (~(this->domain).bigend.vect[2] + (this->domain).smallend.vect[2]) * iVar4
                  ;
                  locsrc.smallend.vect[2] = locsrc.smallend.vect[2] + iVar5;
                  locsrc.bigend.vect[2] = locsrc.bigend.vect[2] + iVar5;
                }
              }
            }
            else if ((this->super_CoordSys).field_0x53 == '\x01') {
              iVar5 = (((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
                      iVar4;
              locsrc.smallend.vect[2] = locsrc.smallend.vect[2] + iVar5;
              locsrc.bigend.vect[2] = locsrc.bigend.vect[2] + iVar5;
              goto LAB_005349c8;
            }
          }
          if ((iVar3 != 0) && ((this->super_CoordSys).field_0x52 == '\x01')) {
            iVar4 = (~(this->domain).bigend.vect[1] + (this->domain).smallend.vect[1]) * iVar3;
            locsrc.smallend.vect[1] = locsrc.smallend.vect[1] + iVar4;
            locsrc.bigend.vect[1] = locsrc.bigend.vect[1] + iVar4;
          }
        }
        else if ((this->super_CoordSys).field_0x52 == '\x01') {
          iVar4 = (((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1) * iVar3;
          locsrc.smallend.vect[1] = locsrc.smallend.vect[1] + iVar4;
          locsrc.bigend.vect[1] = locsrc.bigend.vect[1] + iVar4;
          goto LAB_00534988;
        }
      }
      if ((iVar6 != 0) && ((this->super_CoordSys).field_0x51 == '\x01')) {
        iVar3 = (~(this->domain).bigend.vect[0] + (this->domain).smallend.vect[0]) * iVar6;
        locsrc.smallend.vect[0] = locsrc.smallend.vect[0] + iVar3;
        locsrc.bigend.vect[0] = locsrc.bigend.vect[0] + iVar3;
      }
    }
    else if ((this->super_CoordSys).field_0x51 == '\x01') {
      iVar3 = (((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) * iVar6;
      locsrc.smallend.vect[0] = locsrc.smallend.vect[0] + iVar3;
      locsrc.bigend.vect[0] = locsrc.bigend.vect[0] + iVar3;
      goto LAB_00534952;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void
Geometry::periodicShift (const Box&      target,
                         const Box&      src,
                         Vector<IntVect>& out) const noexcept
{
    out.resize(0);

    Box locsrc(src);

    int nist  = -1;
    int niend =  1;
#if (AMREX_SPACEDIM > 1)
    int njst  = -1;
    int njend =  1;
#else
    int njst  = 0;
    int njend = 0;
#endif
#if (AMREX_SPACEDIM > 2)
    int nkst  = -1;
    int nkend =  1;
#else
    int nkst  = 0;
    int nkend = 0;
#endif

    int ri,rj,rk;
    for (ri = nist; ri <= niend; ri++)
    {
        if (ri != 0 && !is_periodic[0])
            continue;
        if (ri != 0 && is_periodic[0])
            locsrc.shift(0,ri*domain.length(0));

        for (rj = njst; rj <= njend; rj++)
        {
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && !is_periodic[1]
#endif
                )
            {
                continue;
            }
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && is_periodic[1]
#endif
                )
            {
                locsrc.shift(1,rj*domain.length(1));
            }

            for (rk = nkst; rk <= nkend; rk++)
            {
                if (rk!=0
#if (AMREX_SPACEDIM == 3)
                    && !is_periodic[2]
#endif
                    )
                {
                    continue;
                }
                if (rk!=0
#if (AMREX_SPACEDIM == 3)
                    && is_periodic[2]
#endif
                    )
                {
                    locsrc.shift(2,rk*domain.length(2));
                }

                if (ri == 0 && rj == 0 && rk == 0)
                    continue;
                //
                // If losrc intersects target, then add to "out".
                //
                if (target.intersects(locsrc))
                {
                    out.push_back(IntVect(AMREX_D_DECL(ri*domain.length(0),
                                                 rj*domain.length(1),
                                                 rk*domain.length(2))));
                }
                if (rk != 0
#if (AMREX_SPACEDIM == 3)
                    && is_periodic[2]
#endif
                    )
                {
                    locsrc.shift(2,-rk*domain.length(2));
                }
            }
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && is_periodic[1]
#endif
                )
            {
                locsrc.shift(1,-rj*domain.length(1));
            }
        }
        if (ri != 0 && is_periodic[0])
            locsrc.shift(0,-ri*domain.length(0));
    }
}